

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_vtk.cpp
# Opt level: O1

void Omega_h::vtk::write_array<long,long>
               (ostream *stream,string *name,Int ncomps,Read<long> *array,bool compress)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  Alloc *pAVar4;
  long lVar5;
  int iVar6;
  long *plVar7;
  undefined8 *puVar8;
  Now NVar9;
  ulong uVar10;
  base64 *pbVar11;
  ulong *puVar12;
  undefined1 *puVar13;
  size_t size;
  void *size_00;
  undefined8 uVar14;
  bool bVar15;
  Real RVar16;
  double dVar17;
  ScopedTimer omega_h_scoped_function_timer;
  string encoded;
  string enc_header;
  uint64_t header [4];
  uint64_t uncompressed_bytes;
  uLong dest_bytes;
  string __str;
  HostRead<long> uncompressed;
  ScopedTimer local_f1;
  double local_f0;
  ulong *local_e8;
  long local_e0;
  ulong local_d8;
  long lStack_d0;
  ulong *local_c8;
  undefined8 local_c0;
  ulong local_b8;
  undefined8 uStack_b0;
  string local_a8;
  void *local_80;
  void *local_78;
  string local_70;
  Read<signed_char> local_50;
  HostRead<long> local_40;
  
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
             ,"");
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_a8);
  local_e8 = &local_d8;
  puVar12 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar12) {
    local_d8 = *puVar12;
    lStack_d0 = plVar7[3];
  }
  else {
    local_d8 = *puVar12;
    local_e8 = (ulong *)*plVar7;
  }
  local_e0 = plVar7[1];
  *plVar7 = (long)puVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  paVar2 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct((ulong)&local_70,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>(local_70._M_dataplus._M_p,3,0x7f);
  uVar10 = 0xf;
  if (local_e8 != &local_d8) {
    uVar10 = local_d8;
  }
  if (uVar10 < local_70._M_string_length + local_e0) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar2) {
      uVar14 = local_70.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_70._M_string_length + local_e0) goto LAB_0042b531;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_e8);
  }
  else {
LAB_0042b531:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_70._M_dataplus._M_p);
  }
  local_c8 = &local_b8;
  puVar12 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar12) {
    local_b8 = *puVar12;
    uStack_b0 = puVar8[3];
  }
  else {
    local_b8 = *puVar12;
    local_c8 = (ulong *)*puVar8;
  }
  local_c0 = puVar8[1];
  *puVar8 = puVar12;
  puVar8[1] = 0;
  *(undefined1 *)puVar12 = 0;
  begin_code("write_array",(char *)local_c8);
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,local_b8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,local_d8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((array->write_).shared_alloc_.direct_ptr == (void *)0x0) {
    fail("vtk::write_array: \"%s\" doesn\'t exist\n",(name->_M_dataplus)._M_p);
  }
  begin_code("header",(char *)0x0);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"<DataArray ",0xb);
  describe_array<long>(stream,name,ncomps);
  std::__ostream_insert<char,std::char_traits<char>>(stream,">\n",2);
  plVar7 = profile::global_singleton_history;
  if (profile::global_singleton_history != (long *)0x0) {
    local_f0 = *(double *)
                (*profile::global_singleton_history + 0x30 +
                profile::global_singleton_history[3] * 0x40);
    NVar9 = now();
    RVar16 = operator-(NVar9,(Impl)((Impl *)(*plVar7 + 0x28 + plVar7[3] * 0x40))->__d);
    lVar3 = *plVar7;
    puVar12 = (ulong *)(plVar7[3] * 0x40);
    *(double *)(lVar3 + 0x30 + (long)puVar12) = local_f0 + RVar16;
    plVar7[3] = *(long *)(lVar3 + (long)puVar12);
  }
  local_50.write_.shared_alloc_.alloc = (array->write_).shared_alloc_.alloc;
  puVar13 = (undefined1 *)
            CONCAT71((int7)((ulong)puVar12 >> 8),local_50.write_.shared_alloc_.alloc == (Alloc *)0x0
                    );
  if (((ulong)local_50.write_.shared_alloc_.alloc & 7) == 0 &&
      local_50.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    puVar13 = &entering_parallel;
    if (entering_parallel == '\x01') {
      local_50.write_.shared_alloc_.alloc =
           (Alloc *)((local_50.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_50.write_.shared_alloc_.alloc)->use_count =
           (local_50.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_50.write_.shared_alloc_.direct_ptr = (array->write_).shared_alloc_.direct_ptr;
  HostRead<long>::HostRead(&local_40,&local_50);
  pAVar4 = local_50.write_.shared_alloc_.alloc;
  bVar15 = ((ulong)local_50.write_.shared_alloc_.alloc & 7) != 0;
  size = CONCAT71((int7)((ulong)puVar13 >> 8),
                  bVar15 || local_50.write_.shared_alloc_.alloc == (Alloc *)0x0);
  if (!bVar15 && local_50.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_50.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_50.write_.shared_alloc_.alloc);
      operator_delete(pAVar4,0x48);
    }
  }
  pAVar4 = (array->write_).shared_alloc_.alloc;
  if (((ulong)pAVar4 & 1) == 0) {
    uVar10 = pAVar4->size;
  }
  else {
    uVar10 = (ulong)pAVar4 >> 3;
  }
  local_e8 = &local_d8;
  local_80 = (void *)((long)(uVar10 << 0x1d) >> 0x1d & 0xfffffffffffffff8);
  local_c8 = &local_b8;
  local_c0 = 0;
  local_b8 = local_b8 & 0xffffffffffffff00;
  local_e0 = 0;
  local_d8 = local_d8 & 0xffffffffffffff00;
  if (compress) {
    begin_code("zlib",(char *)0x0);
    size_00 = local_80;
    local_78 = (void *)compressBound(local_80);
    pbVar11 = (base64 *)operator_new__((ulong)local_78);
    plVar7 = HostRead<long>::data(&local_40);
    plVar7 = nonnull<long_const>(plVar7);
    iVar6 = compress2(pbVar11,&local_78,plVar7,size_00,1);
    plVar7 = profile::global_singleton_history;
    if (profile::global_singleton_history != (long *)0x0) {
      local_f0 = *(double *)
                  (*profile::global_singleton_history + 0x30 +
                  profile::global_singleton_history[3] * 0x40);
      NVar9 = now();
      RVar16 = operator-(NVar9,(Impl)((Impl *)(*plVar7 + 0x28 + plVar7[3] * 0x40))->__d);
      lVar3 = *plVar7;
      size_00 = (void *)(plVar7[3] * 0x40);
      *(double *)(lVar3 + 0x30 + (long)size_00) = local_f0 + RVar16;
      plVar7[3] = *(long *)(lVar3 + (long)size_00);
    }
    if (iVar6 != 0) {
      fail("assertion %s failed at %s +%d\n","ret == Z_OK",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
           ,0x97);
    }
    begin_code("base64",(char *)0x0);
    base64::encode_abi_cxx11_(&local_a8,pbVar11,local_78,(size_t)size_00);
    std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    operator_delete__(pbVar11);
    local_a8._M_dataplus._M_p = (pointer)0x1;
    local_a8._M_string_length = (size_type)local_80;
    local_a8.field_2._M_allocated_capacity = (size_type)local_80;
    local_a8.field_2._8_8_ = local_78;
    base64::encode_abi_cxx11_(&local_70,(base64 *)&local_a8,(void *)0x20,(size_t)size_00);
    std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    plVar7 = profile::global_singleton_history;
    if (profile::global_singleton_history == (long *)0x0) goto LAB_0042ba87;
    local_f0 = *(double *)
                (*profile::global_singleton_history + 0x30 +
                profile::global_singleton_history[3] * 0x40);
    NVar9 = now();
    dVar17 = operator-(NVar9,(Impl)((Impl *)(*plVar7 + 0x28 + plVar7[3] * 0x40))->__d);
  }
  else {
    begin_code("base64 bulk",(char *)0x0);
    base64::encode_abi_cxx11_(&local_a8,(base64 *)&local_80,(void *)0x8,size);
    std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    plVar7 = HostRead<long>::data(&local_40);
    pbVar11 = (base64 *)nonnull<long_const>(plVar7);
    base64::encode_abi_cxx11_(&local_a8,pbVar11,local_80,size);
    std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    plVar7 = profile::global_singleton_history;
    if (profile::global_singleton_history == (long *)0x0) goto LAB_0042ba87;
    local_f0 = *(double *)
                (*profile::global_singleton_history + 0x30 +
                profile::global_singleton_history[3] * 0x40);
    NVar9 = now();
    dVar17 = operator-(NVar9,(Impl)((Impl *)(*plVar7 + 0x28 + plVar7[3] * 0x40))->__d);
  }
  lVar3 = *plVar7;
  lVar5 = plVar7[3];
  *(double *)(lVar3 + 0x30 + lVar5 * 0x40) = local_f0 + dVar17;
  plVar7[3] = *(long *)(lVar3 + lVar5 * 0x40);
LAB_0042ba87:
  begin_code("stream bulk",(char *)0x0);
  std::ostream::write((char *)stream,(long)local_c8);
  std::ostream::write((char *)stream,(long)local_e8);
  std::ostream::write((char *)stream,0x4541a6);
  plVar7 = profile::global_singleton_history;
  if (profile::global_singleton_history != (long *)0x0) {
    local_f0 = *(double *)
                (*profile::global_singleton_history + 0x30 +
                profile::global_singleton_history[3] * 0x40);
    NVar9 = now();
    RVar16 = operator-(NVar9,(Impl)((Impl *)(*plVar7 + 0x28 + plVar7[3] * 0x40))->__d);
    lVar3 = *plVar7;
    lVar5 = plVar7[3];
    *(double *)(lVar3 + 0x30 + lVar5 * 0x40) = local_f0 + RVar16;
    plVar7[3] = *(long *)(lVar3 + lVar5 * 0x40);
  }
  begin_code("footer",(char *)0x0);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"</DataArray>\n",0xd);
  plVar7 = profile::global_singleton_history;
  if (profile::global_singleton_history != (long *)0x0) {
    local_f0 = *(double *)
                (*profile::global_singleton_history + 0x30 +
                profile::global_singleton_history[3] * 0x40);
    NVar9 = now();
    RVar16 = operator-(NVar9,(Impl)((Impl *)(*plVar7 + 0x28 + plVar7[3] * 0x40))->__d);
    lVar3 = *plVar7;
    lVar5 = plVar7[3];
    *(double *)(lVar3 + 0x30 + lVar5 * 0x40) = local_f0 + RVar16;
    plVar7[3] = *(long *)(lVar3 + lVar5 * 0x40);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,local_d8 + 1);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,local_b8 + 1);
  }
  if (((ulong)local_40.read_.write_.shared_alloc_.alloc & 7) == 0 &&
      local_40.read_.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_40.read_.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_40.read_.write_.shared_alloc_.alloc);
      operator_delete(local_40.read_.write_.shared_alloc_.alloc,0x48);
    }
  }
  ScopedTimer::~ScopedTimer(&local_f1);
  return;
}

Assistant:

void write_array(std::ostream& stream, std::string const& name, Int ncomps,
    Read<T_osh> array, bool compress) {
  OMEGA_H_TIME_FUNCTION;
  if (!(array.exists())) {
    Omega_h_fail("vtk::write_array: \"%s\" doesn't exist\n", name.c_str());
  }
  begin_code("header");
  stream << "<DataArray ";
  describe_array<T_vtk>(stream, name, ncomps);
  stream << ">\n";
  end_code();
  HostRead<T_osh> uncompressed(array);
  std::uint64_t uncompressed_bytes =
      sizeof(T_osh) * static_cast<uint64_t>(array.size());
  std::string enc_header;
  std::string encoded;
#ifdef OMEGA_H_USE_ZLIB
  if (compress) {
    begin_code("zlib");
    uLong source_bytes = uncompressed_bytes;
    uLong dest_bytes = ::compressBound(source_bytes);
    auto compressed = new ::Bytef[dest_bytes];
    int ret = ::compress2(compressed, &dest_bytes,
        reinterpret_cast<const ::Bytef*>(nonnull(uncompressed.data())),
        source_bytes, Z_BEST_SPEED);
    end_code();
    OMEGA_H_CHECK(ret == Z_OK);
    begin_code("base64");
    encoded = base64::encode(compressed, dest_bytes);
    delete[] compressed;
    std::uint64_t header[4] = {
        1, uncompressed_bytes, uncompressed_bytes, dest_bytes};
    enc_header = base64::encode(header, sizeof(header));
    end_code();
  } else
#else
  OMEGA_H_CHECK(!compress);
#endif
  {
    begin_code("base64 bulk");
    enc_header = base64::encode(&uncompressed_bytes, sizeof(std::uint64_t));
    encoded = base64::encode(nonnull(uncompressed.data()), uncompressed_bytes);
    end_code();
  }
  begin_code("stream bulk");
  // stream << enc_header << encoded << '\n';
  // the following three lines are 30% faster than the above line
  stream.write(enc_header.data(), std::streamsize(enc_header.length()));
  stream.write(encoded.data(), std::streamsize(encoded.length()));
  stream.write("\n", 1);
  end_code();
  begin_code("footer");
  stream << "</DataArray>\n";
  end_code();
}